

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

void __thiscall
cnn::Tensor::load<boost::archive::text_iarchive>(Tensor *this,text_iarchive *ar,uint param_2)

{
  uint uVar1;
  float *pfVar2;
  array_wrapper<float> a;
  
  boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
  invoke<cnn::Dim>(ar,&this->d);
  uVar1 = Dim::size(&this->d);
  pfVar2 = (float *)cnn_mm_malloc((ulong)uVar1 << 2,0x20);
  this->v = pfVar2;
  uVar1 = Dim::size(&this->d);
  a.m_element_count = (size_t)uVar1;
  a.m_t = pfVar2;
  boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_only::
  invoke<boost::serialization::array_wrapper<float>>(ar,&a);
  return;
}

Assistant:

void load(Archive& ar, const unsigned int) {
    ar & d;
#if HAVE_CUDA
    CUDA_CHECK(cudaMalloc(&v, d.size() * sizeof(float)));
    float* vc = static_cast<float*>(std::malloc(d.size() * sizeof(float)));
    ar & boost::serialization::make_array(vc, d.size());
    CUDA_CHECK(cudaMemcpyAsync(v, vc, d.size() * sizeof(float), cudaMemcpyHostToDevice));
#else
    v = static_cast<float*>(cnn_mm_malloc(d.size() * sizeof(float), 32));
    ar & boost::serialization::make_array(v, d.size());
#endif
  }